

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O0

void __thiscall cppforth::Forth::deleteFile(Forth *this)

{
  uint src;
  uint uVar1;
  int iVar2;
  char *__filename;
  int result;
  undefined1 local_40 [8];
  string filename;
  size_t length;
  uint caddr;
  Forth *this_local;
  
  requireDStackDepth(this,2,"DELETE-FILE");
  src = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  filename.field_2._8_8_ = ZEXT48(uVar1);
  pop(this);
  std::__cxx11::string::string((string *)local_40);
  moveFromDataSpace(this,(string *)local_40,src,filename.field_2._8_8_);
  __filename = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  iVar2 = remove(__filename);
  ForthStack<unsigned_int>::setTop(&this->dStack,(uint)(iVar2 == 0) * 0x40 - 0x40);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void deleteFile() {
	REQUIRE_DSTACK_DEPTH(2, "DELETE-FILE");

	auto caddr = (dStack.getTop(1));
	auto length = SIZE_T(dStack.getTop()); pop();

	std::string filename{};
	moveFromDataSpace(filename, caddr, length);
	auto result = std::remove(filename.c_str());
	dStack.setTop(static_cast<Cell>(result?errorDeleteFile:0));
}